

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_x86_mov64Absolute
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,uint64_t value)

{
  uint8_t instruction [10];
  
  instruction[0] = 'H';
  instruction[1] = (byte)destination & 7 | 0xb8;
  instruction[2] = (uint8_t)value;
  instruction[3] = (uint8_t)(value >> 8);
  instruction[4] = (uint8_t)(value >> 0x10);
  instruction[5] = (uint8_t)(value >> 0x18);
  instruction[6] = (uint8_t)(value >> 0x20);
  instruction[7] = (uint8_t)(value >> 0x28);
  instruction[8] = (uint8_t)(value >> 0x30);
  instruction[9] = (uint8_t)(value >> 0x38);
  sysbvm_bytecodeJit_addBytes(jit,10,instruction);
  return;
}

Assistant:

static void sysbvm_jit_x86_mov64Absolute(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, uint64_t value)
{
    uint8_t instruction[] = {
        sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
        0xB8 + (destination & SYSBVM_X86_REG_HALF_MASK),
        value & 0xFF, (value >> 8) & 0xFF, (value >> 16) & 0xFF, (value >> 24) & 0xFF,
        (value >> 32) & 0xFF, (value >> 40) & 0xFF, (value >> 48) & 0xFF, (value >> 56) & 0xFF,
    };

    sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
}